

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O0

lyd_node * lyd_parse_xml(ly_ctx *ctx,lyxml_elem **root,int options,...)

{
  lyd_node *plVar1;
  char in_AL;
  int iVar2;
  lyd_node *source;
  lyd_node *in_RCX;
  LY_VLOG_ELEM elem_type;
  undefined8 in_R8;
  char *pcVar3;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  lyxml_elem *local_1d8;
  undefined8 *local_1c0;
  long *local_1a8;
  undefined1 local_178 [24];
  lyd_node *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  char *local_c0;
  char *yang_data_name;
  lyxml_elem *xmlfree;
  lyxml_elem *xmlaux;
  lyxml_elem *xmlelem;
  lyxml_elem *xmlstart;
  lyd_node *act_notif;
  lyd_node *reply_top;
  lyd_node *reply_parent;
  lyd_node *last;
  lyd_node *iter;
  lyd_node *result;
  lyd_node *data_tree;
  lyd_node *rpc_act;
  unres_data *unres;
  uint local_48;
  int r;
  va_list ap;
  int options_local;
  lyxml_elem **root_local;
  ly_ctx *ctx_local;
  
  if (in_AL != '\0') {
    local_148 = in_XMM0_Qa;
    local_138 = in_XMM1_Qa;
    local_128 = in_XMM2_Qa;
    local_118 = in_XMM3_Qa;
    local_108 = in_XMM4_Qa;
    local_f8 = in_XMM5_Qa;
    local_e8 = in_XMM6_Qa;
    local_d8 = in_XMM7_Qa;
  }
  rpc_act = (lyd_node *)0x0;
  data_tree = (lyd_node *)0x0;
  result = (lyd_node *)0x0;
  iter = (lyd_node *)0x0;
  reply_top = (lyd_node *)0x0;
  act_notif = (lyd_node *)0x0;
  xmlstart = (lyxml_elem *)0x0;
  yang_data_name = (char *)0x0;
  local_c0 = (char *)0x0;
  local_160 = in_RCX;
  local_158 = in_R8;
  local_150 = in_R9;
  ap[0].reg_save_area._4_4_ = options;
  if ((ctx == (ly_ctx *)0x0) || (root == (lyxml_elem **)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_parse_xml");
    return (lyd_node *)0x0;
  }
  iVar2 = lyp_data_check_options(ctx,options,"lyd_parse_xml");
  if (iVar2 != 0) {
    return (lyd_node *)0x0;
  }
  if ((*root == (lyxml_elem *)0x0) && ((ap[0].reg_save_area._4_4_ & 0x20) == 0)) {
    if ((ap[0].reg_save_area._4_4_ & 0x50) != 0) {
      ly_log(ctx,LY_LLERR,LY_EINVAL,"%s: *root identifies RPC/Notification so it cannot be NULL.",
             "lyd_parse_xml");
      return (lyd_node *)0x0;
    }
    if ((ap[0].reg_save_area._4_4_ & 0x20) == 0) {
      lyd_validate(&iter,ap[0].reg_save_area._4_4_,ctx);
      return iter;
    }
  }
  rpc_act = (lyd_node *)calloc(1,0x28);
  if (rpc_act == (lyd_node *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_parse_xml");
    return (lyd_node *)0x0;
  }
  ap[0].overflow_arg_area = local_178;
  ap[0]._0_8_ = &stack0x00000008;
  r = 0x30;
  local_48 = 0x18;
  if ((ap[0].reg_save_area._4_4_ & 0x20) != 0) {
    r = 0x30;
    local_48 = 0x20;
    data_tree = local_160;
    if (((local_160 == (lyd_node *)0x0) || (local_160->parent != (lyd_node *)0x0)) ||
       ((local_160->schema->nodetype & (LYS_RPC|LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN)) {
      ly_log(ctx,LY_LLERR,LY_EINVAL,
             "%s: invalid variable parameter (const struct lyd_node *rpc_act).","lyd_parse_xml");
      goto LAB_0015c779;
    }
    if (local_160->schema->nodetype == LYS_RPC) {
      act_notif = _lyd_new((lyd_node *)0x0,local_160->schema,0);
      reply_top = act_notif;
    }
    else {
      act_notif = lyd_dup(local_160,1);
      last = act_notif;
      while ((reply_top = last, last != (lyd_node *)0x0 && (last->schema->nodetype != LYS_ACTION)))
      {
        if ((last->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
          last = last->child;
        }
        else {
          last = (lyd_node *)0x0;
        }
        if (last == (lyd_node *)0x0) {
          if (reply_top == act_notif) break;
          last = reply_top->next;
        }
        while ((last == (lyd_node *)0x0 &&
               (reply_top = reply_top->parent, reply_top->parent != act_notif->parent))) {
          last = reply_top->next;
        }
      }
      if (reply_top == (lyd_node *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,
               "%s: invalid variable parameter (const struct lyd_node *rpc_act).","lyd_parse_xml");
        lyd_free_withsiblings(act_notif);
        goto LAB_0015c779;
      }
      lyd_free_withsiblings(reply_top->child);
    }
  }
  if ((ap[0].reg_save_area._4_4_ & 0x70) != 0) {
    if (local_48 < 0x29) {
      local_1a8 = (long *)((long)(int)local_48 + (long)ap[0].overflow_arg_area);
      local_48 = local_48 + 8;
    }
    else {
      local_1a8 = (long *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    result = (lyd_node *)*local_1a8;
    if (result != (lyd_node *)0x0) {
      plVar1 = result;
      if ((ap[0].reg_save_area._4_4_ & 0x8000) != 0) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,
               "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set)."
               ,"lyd_parse_xml");
        goto LAB_0015c779;
      }
      while (last = plVar1, last != (lyd_node *)0x0) {
        if (last->parent != (lyd_node *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EINVAL,
                 "%s: invalid variable parameter (const struct lyd_node *data_tree).",
                 "lyd_parse_xml");
          goto LAB_0015c779;
        }
        plVar1 = last->next;
      }
      while (result->prev->next != (lyd_node *)0x0) {
        result = result->prev;
      }
      if ((ap[0].reg_save_area._4_4_ & 0x1000) != 0) {
        ly_log(ctx,LY_LLERR,LY_EINVAL,
               "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS)."
               ,"lyd_parse_xml");
        goto LAB_0015c779;
      }
    }
  }
  if ((ap[0].reg_save_area._4_4_ & 0x1000000) != 0) {
    if (local_48 < 0x29) {
      local_1c0 = (undefined8 *)((long)(int)local_48 + (long)ap[0].overflow_arg_area);
      local_48 = local_48 + 8;
    }
    else {
      local_1c0 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    local_c0 = (char *)*local_1c0;
  }
  if ((*root == (lyxml_elem *)0x0) || ((ap[0].reg_save_area._4_4_ & 0x1000) != 0)) {
    xmlelem = *root;
  }
  else if ((*root)->parent == (lyxml_elem *)0x0) {
    xmlelem = *root;
    while (xmlelem->prev->next != (lyxml_elem *)0x0) {
      xmlelem = xmlelem->prev;
    }
  }
  else {
    xmlelem = (*root)->parent->child;
  }
  if (((((ap[0].reg_save_area._4_4_ & 0x10) != 0) &&
       (iVar2 = strcmp(xmlelem->name,"action"), iVar2 == 0)) &&
      (iVar2 = strcmp(xmlelem->ns->value,"urn:ietf:params:xml:ns:yang:1"), iVar2 == 0)) &&
     (xmlelem = xmlelem->child, (ap[0].reg_save_area._4_4_ & 0x400) != 0)) {
    yang_data_name = &xmlelem->parent->flags;
  }
  reply_parent = (lyd_node *)0x0;
  last = (lyd_node *)0x0;
  xmlaux = xmlelem;
  while (xmlaux != (lyxml_elem *)0x0) {
    xmlfree = xmlaux->next;
    unres._4_4_ = xml_parse_data(ctx,xmlaux,reply_top,iter,reply_parent,ap[0].reg_save_area._4_4_,
                                 (unres_data *)rpc_act,&last,(lyd_node **)&xmlstart,local_c0);
    if (unres._4_4_ != 0) {
      if (act_notif != (lyd_node *)0x0) {
        iter = act_notif;
      }
      goto LAB_0015c779;
    }
    if ((ap[0].reg_save_area._4_4_ & 0x400) != 0) {
      lyxml_free(ctx,xmlaux);
      *root = xmlfree;
    }
    if (((last != (lyd_node *)0x0) &&
        (reply_parent = last, (ap[0].reg_save_area._4_4_ & 0x20000) != 0)) &&
       (last->schema->module == (ctx->models).list[(int)(ctx->internal_module_count - 1)])) {
      ap[0].reg_save_area._4_4_ = ap[0].reg_save_area._4_4_ & 0xfffdffff;
    }
    if (iter == (lyd_node *)0x0) {
      iter = last;
    }
    if ((ap[0].reg_save_area._4_4_ & 0x1000) != 0) break;
    xmlaux = xmlfree;
  }
  if (act_notif != (lyd_node *)0x0) {
    iter = act_notif;
  }
  plVar1 = iter;
  if (((ap[0].reg_save_area._4_4_ & 0x20) == 0) || (data_tree->schema->nodetype == LYS_RPC)) {
    if (((ap[0].reg_save_area._4_4_ & 0x50) != 0) && (xmlstart == (lyxml_elem *)0x0)) {
      elem_type = LY_VLOG_NONE;
      if (iter != (lyd_node *)0x0) {
        elem_type = LY_VLOG_LYD;
      }
      pcVar3 = "notification";
      if ((ap[0].reg_save_area._4_4_ & 0x10) != 0) {
        pcVar3 = "action";
      }
      ly_vlog(ctx,LYE_INELEM,elem_type,iter,pcVar3);
      goto LAB_0015c779;
    }
  }
  else {
    xmlstart = (lyxml_elem *)reply_top;
  }
  if ((ap[0].reg_save_area._4_4_ & 0x20000) != 0) {
    if (iter == (lyd_node *)0x0) {
      iter = ly_ctx_info(ctx);
    }
    else {
      source = ly_ctx_info(ctx);
      iVar2 = lyd_merge(plVar1,source,0x500);
      if (iVar2 != 0) {
        ly_log(ctx,LY_LLERR,LY_EINT,"Adding ietf-yang-library data failed.");
        goto LAB_0015c779;
      }
    }
  }
  for (last = iter; last != (lyd_node *)0x0; last = last->next) {
    if ((((last->schema->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) &&
        ((last->validity & 1) != 0)) && (iVar2 = lyv_data_dup(last,iter), iVar2 != 0))
    goto LAB_0015c779;
  }
  iVar2 = lyd_defaults_add_unres
                    (&iter,ap[0].reg_save_area._4_4_,ctx,(lys_module **)0x0,0,result,
                     (lyd_node *)xmlstart,(unres_data *)rpc_act,1);
  if (iVar2 != 0) {
LAB_0015c779:
    lyd_free_withsiblings(iter);
    if (yang_data_name != (char *)0x0) {
      lyxml_free(ctx,(lyxml_elem *)yang_data_name);
    }
    free(rpc_act->schema);
    free(*(void **)&rpc_act->validity);
    free(rpc_act);
    return (lyd_node *)0x0;
  }
  if ((ap[0].reg_save_area._4_4_ & 0x2080) == 0) {
    if (xmlstart == (lyxml_elem *)0x0) {
      local_1d8 = (lyxml_elem *)iter;
    }
    else {
      local_1d8 = xmlstart;
    }
    iVar2 = lyd_check_mandatory_tree
                      ((lyd_node *)local_1d8,ctx,(lys_module **)0x0,0,ap[0].reg_save_area._4_4_);
    if (iVar2 != 0) goto LAB_0015c779;
  }
  if (yang_data_name != (char *)0x0) {
    lyxml_free(ctx,(lyxml_elem *)yang_data_name);
  }
  free(rpc_act->schema);
  free(*(void **)&rpc_act->validity);
  free(rpc_act);
  return iter;
}

Assistant:

lyd_node *
lyd_parse_xml(struct ly_ctx *ctx, struct lyxml_elem **root, int options, ...)
{
    va_list ap;
    int r;
    struct unres_data *unres = NULL;
    const struct lyd_node *rpc_act = NULL, *data_tree = NULL;
    struct lyd_node *result = NULL, *iter, *last, *reply_parent = NULL, *reply_top = NULL, *act_notif = NULL;
    struct lyxml_elem *xmlstart, *xmlelem, *xmlaux, *xmlfree = NULL;
    const char *yang_data_name = NULL;

    if (!ctx || !root) {
        LOGARG;
        return NULL;
    }

    if (lyp_data_check_options(ctx, options, __func__)) {
        return NULL;
    }

    if (!(*root) && !(options & LYD_OPT_RPCREPLY)) {
        /* empty tree */
        if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) {
            /* error, top level node identify RPC and Notification */
            LOGERR(ctx, LY_EINVAL, "%s: *root identifies RPC/Notification so it cannot be NULL.", __func__);
            return NULL;
        } else if (!(options & LYD_OPT_RPCREPLY)) {
            /* others - no work is needed, just check for missing mandatory nodes */
            lyd_validate(&result, options, ctx);
            return result;
        }
        /* continue with empty RPC reply, for which we need RPC */
    }

    unres = calloc(1, sizeof *unres);
    LY_CHECK_ERR_RETURN(!unres, LOGMEM(ctx), NULL);

    va_start(ap, options);
    if (options & LYD_OPT_RPCREPLY) {
        rpc_act = va_arg(ap, const struct lyd_node *);
        if (!rpc_act || rpc_act->parent || !(rpc_act->schema->nodetype & (LYS_RPC | LYS_LIST | LYS_CONTAINER))) {
            LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
            goto error;
        }
        if (rpc_act->schema->nodetype == LYS_RPC) {
            /* RPC request */
            reply_top = reply_parent = _lyd_new(NULL, rpc_act->schema, 0);
        } else {
            /* action request */
            reply_top = lyd_dup(rpc_act, 1);
            LY_TREE_DFS_BEGIN(reply_top, iter, reply_parent) {
                if (reply_parent->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(reply_top, iter, reply_parent);
            }
            if (!reply_parent) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *rpc_act).", __func__);
                lyd_free_withsiblings(reply_top);
                goto error;
            }
            lyd_free_withsiblings(reply_parent->child);
        }
    }
    if (options & (LYD_OPT_RPC | LYD_OPT_NOTIF | LYD_OPT_RPCREPLY)) {
        data_tree = va_arg(ap, const struct lyd_node *);
        if (data_tree) {
            if (options & LYD_OPT_NOEXTDEPS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree and LYD_OPT_NOEXTDEPS set).",
                       __func__);
                goto error;
            }

            LY_TREE_FOR((struct lyd_node *)data_tree, iter) {
                if (iter->parent) {
                    /* a sibling is not top-level */
                    LOGERR(ctx, LY_EINVAL, "%s: invalid variable parameter (const struct lyd_node *data_tree).", __func__);
                    goto error;
                }
            }

            /* move it to the beginning */
            for (; data_tree->prev->next; data_tree = data_tree->prev);

            /* LYD_OPT_NOSIBLINGS cannot be set in this case */
            if (options & LYD_OPT_NOSIBLINGS) {
                LOGERR(ctx, LY_EINVAL, "%s: invalid parameter (variable arg const struct lyd_node *data_tree with LYD_OPT_NOSIBLINGS).", __func__);
                goto error;
            }
        }
    }
    if (options & LYD_OPT_DATA_TEMPLATE) {
        yang_data_name = va_arg(ap, const char *);
    }

    if ((*root) && !(options & LYD_OPT_NOSIBLINGS)) {
        /* locate the first root to process */
        if ((*root)->parent) {
            xmlstart = (*root)->parent->child;
        } else {
            xmlstart = *root;
            while(xmlstart->prev->next) {
                xmlstart = xmlstart->prev;
            }
        }
    } else {
        xmlstart = *root;
    }

    if ((options & LYD_OPT_RPC)
            && !strcmp(xmlstart->name, "action") && !strcmp(xmlstart->ns->value, "urn:ietf:params:xml:ns:yang:1")) {
        /* it's an action, not a simple RPC */
        xmlstart = xmlstart->child;
        if (options & LYD_OPT_DESTRUCT) {
            /* free it later */
            xmlfree = xmlstart->parent;
        }
    }

    iter = last = NULL;
    LY_TREE_FOR_SAFE(xmlstart, xmlaux, xmlelem) {
        r = xml_parse_data(ctx, xmlelem, reply_parent, result, last, options, unres, &iter, &act_notif, yang_data_name);
        if (r) {
            if (reply_top) {
                result = reply_top;
            }
            goto error;
        } else if (options & LYD_OPT_DESTRUCT) {
            lyxml_free(ctx, xmlelem);
            *root = xmlaux;
        }
        if (iter) {
            last = iter;
            if ((options & LYD_OPT_DATA_ADD_YANGLIB) && iter->schema->module == ctx->models.list[ctx->internal_module_count - 1]) {
                /* ietf-yang-library data present, so ignore the option to add them */
                options &= ~LYD_OPT_DATA_ADD_YANGLIB;
            }
        }
        if (!result) {
            result = iter;
        }

        if (options & LYD_OPT_NOSIBLINGS) {
            /* stop after the first processed root */
            break;
        }
    }

    if (reply_top) {
        result = reply_top;
    }

    if ((options & LYD_OPT_RPCREPLY) && (rpc_act->schema->nodetype != LYS_RPC)) {
        /* action reply */
        act_notif = reply_parent;
    } else if ((options & (LYD_OPT_RPC | LYD_OPT_NOTIF)) && !act_notif) {
        LOGVAL(ctx, LYE_INELEM, (result ? LY_VLOG_LYD : LY_VLOG_NONE), result, (options & LYD_OPT_RPC ? "action" : "notification"));
        goto error;
    }

    /* add missing ietf-yang-library if requested */
    if (options & LYD_OPT_DATA_ADD_YANGLIB) {
        if (!result) {
            result = ly_ctx_info(ctx);
        } else if (lyd_merge(result, ly_ctx_info(ctx), LYD_OPT_DESTRUCT | LYD_OPT_EXPLICIT)) {
            LOGERR(ctx, LY_EINT, "Adding ietf-yang-library data failed.");
            goto error;
        }
    }

    /* check for uniqueness of top-level lists/leaflists because
     * only the inner instances were tested in lyv_data_content() */
    LY_TREE_FOR(result, iter) {
        if (!(iter->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(iter->validity & LYD_VAL_DUP)) {
            continue;
        }

        if (lyv_data_dup(iter, result)) {
            goto error;
        }
    }

    /* add default values, resolve unres and check for mandatory nodes in final tree */
    if (lyd_defaults_add_unres(&result, options, ctx, NULL, 0, data_tree, act_notif, unres, 1)) {
        goto error;
    }
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))
            && lyd_check_mandatory_tree((act_notif ? act_notif : result), ctx, NULL, 0, options)) {
        goto error;
    }

    if (xmlfree) {
        lyxml_free(ctx, xmlfree);
    }
    free(unres->node);
    free(unres->type);
    free(unres);
    va_end(ap);
    return result;

error:
    lyd_free_withsiblings(result);
    if (xmlfree) {
        lyxml_free(ctx, xmlfree);
    }
    free(unres->node);
    free(unres->type);
    free(unres);
    va_end(ap);
    return NULL;
}